

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_movem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  uint16_t uVar1;
  int opsize;
  int val;
  TCGv_i32 pTVar2;
  TCGv_i32 ret;
  TCGv_i32 *ppTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 *ppTVar5;
  uint uVar6;
  uintptr_t o;
  uint reg0;
  long lVar7;
  ulong uVar8;
  uintptr_t o_1;
  TCGv_i32 r [16];
  
  tcg_ctx = s->uc->tcg_ctx;
  opsize = 2 - (uint)((insn & 0x40) == 0);
  uVar1 = read_im16(env,s);
  uVar6 = insn >> 3 & 7;
  reg0 = insn & 7;
  if (uVar6 < 5) {
    pTVar2 = tcg_ctx->cpu_aregs[reg0];
    switch(uVar6) {
    default:
switchD_00677402_caseD_0:
      gen_addr_fault(s);
      return;
    case 2:
      break;
    case 3:
      if ((insn >> 10 & 1) == 0) goto switchD_00677402_caseD_0;
      break;
    case 4:
      if ((insn >> 10 & 1) != 0) goto switchD_00677402_caseD_0;
    }
  }
  else {
    pTVar2 = gen_lea_mode(env,s,uVar6,reg0,opsize);
    if (pTVar2 == tcg_ctx->NULL_QREG) goto switchD_00677402_caseD_0;
  }
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_mov_i32(tcg_ctx,ret,pTVar2);
  val = opsize_bytes(opsize);
  pTVar2 = tcg_const_i32_m68k(tcg_ctx,val);
  if ((insn >> 10 & 1) == 0) {
    if (uVar6 != 4) {
      ppTVar3 = tcg_ctx->cpu_dregs;
      for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
        if ((uVar1 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
          ppTVar5 = tcg_ctx->cpu_aregs + ((uint)uVar8 & 7);
          if (uVar8 < 8) {
            ppTVar5 = ppTVar3;
          }
          gen_store(s,opsize,ret,*ppTVar5,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
          tcg_gen_add_i32(tcg_ctx,ret,ret,pTVar2);
        }
        ppTVar3 = ppTVar3 + 1;
      }
      goto LAB_00677693;
    }
    for (uVar6 = 0xf; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      if ((short)(uVar1 << ((byte)uVar6 & 0x1f)) < 0) {
        tcg_gen_sub_i32(tcg_ctx,ret,ret,pTVar2);
        if ((uVar6 - reg0 == 8) && ((s->env->features & 0x4000) != 0)) {
          pTVar4 = tcg_temp_new_i32(tcg_ctx);
          tcg_gen_sub_i32(tcg_ctx,pTVar4,tcg_ctx->cpu_aregs[reg0],pTVar2);
          gen_store(s,opsize,ret,pTVar4,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
          tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
        }
        else {
          ppTVar3 = tcg_ctx->cpu_aregs + (uVar6 & 7);
          if (uVar6 < 8) {
            ppTVar3 = tcg_ctx->cpu_dregs + uVar6;
          }
          gen_store(s,opsize,ret,*ppTVar3,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
        }
      }
    }
  }
  else {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      if ((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
        pTVar4 = gen_load(s,opsize,ret,1,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
        r[lVar7] = pTVar4;
        tcg_gen_add_i32(tcg_ctx,ret,ret,pTVar2);
      }
    }
    ppTVar3 = tcg_ctx->cpu_dregs;
    for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
      if ((uVar1 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
        ppTVar5 = tcg_ctx->cpu_aregs + ((uint)uVar8 & 7);
        if (uVar8 < 8) {
          ppTVar5 = ppTVar3;
        }
        pTVar4 = r[uVar8];
        tcg_gen_mov_i32(tcg_ctx,*ppTVar5,pTVar4);
        tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      }
      ppTVar3 = ppTVar3 + 1;
    }
    if (uVar6 != 3) goto LAB_00677693;
  }
  tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_aregs[reg0],ret);
LAB_00677693:
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(movem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr, incr, tmp, r[16];
    int is_load = (insn & 0x0400) != 0;
    int opsize = (insn & 0x40) != 0 ? OS_LONG : OS_WORD;
    uint16_t mask = read_im16(env, s);
    int mode = extract32(insn, 3, 3);
    int reg0 = REG(insn, 0);
    int i;

    tmp = tcg_ctx->cpu_aregs[reg0];

    switch (mode) {
    case 0: /* data register direct */
    case 1: /* addr register direct */
    do_addr_fault:
        gen_addr_fault(s);
        return;

    case 2: /* indirect */
        break;

    case 3: /* indirect post-increment */
        if (!is_load) {
            /* post-increment is not allowed */
            goto do_addr_fault;
        }
        break;

    case 4: /* indirect pre-decrement */
        if (is_load) {
            /* pre-decrement is not allowed */
            goto do_addr_fault;
        }
        /*
         * We want a bare copy of the address reg, without any pre-decrement
         * adjustment, as gen_lea would provide.
         */
        break;

    default:
        tmp = gen_lea_mode(env, s, mode, reg0, opsize);
        if (IS_NULL_QREG(tmp)) {
            goto do_addr_fault;
        }
        break;
    }

    addr = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, addr, tmp);
    incr = tcg_const_i32(tcg_ctx, opsize_bytes(opsize));

    if (is_load) {
        /* memory to register */
        for (i = 0; i < 16; i++) {
            if (mask & (1 << i)) {
                r[i] = gen_load(s, opsize, addr, 1, IS_USER(s));
                tcg_gen_add_i32(tcg_ctx, addr, addr, incr);
            }
        }
        for (i = 0; i < 16; i++) {
            if (mask & (1 << i)) {
                tcg_gen_mov_i32(tcg_ctx, mreg(tcg_ctx, i), r[i]);
                tcg_temp_free(tcg_ctx, r[i]);
            }
        }
        if (mode == 3) {
            /* post-increment: movem (An)+,X */
            tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_aregs[reg0], addr);
        }
    } else {
        /* register to memory */
        if (mode == 4) {
            /* pre-decrement: movem X,-(An) */
            for (i = 15; i >= 0; i--) {
                if ((mask << i) & 0x8000) {
                    tcg_gen_sub_i32(tcg_ctx, addr, addr, incr);
                    if (reg0 + 8 == i &&
                        m68k_feature(s->env, M68K_FEATURE_EXT_FULL)) {
                        /*
                         * M68020+: if the addressing register is the
                         * register moved to memory, the value written
                         * is the initial value decremented by the size of
                         * the operation, regardless of how many actual
                         * stores have been performed until this point.
                         * M68000/M68010: the value is the initial value.
                         */
                        tmp = tcg_temp_new(tcg_ctx);
                        tcg_gen_sub_i32(tcg_ctx, tmp, tcg_ctx->cpu_aregs[reg0], incr);
                        gen_store(s, opsize, addr, tmp, IS_USER(s));
                        tcg_temp_free(tcg_ctx, tmp);
                    } else {
                        gen_store(s, opsize, addr, mreg(tcg_ctx, i), IS_USER(s));
                    }
                }
            }
            tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_aregs[reg0], addr);
        } else {
            for (i = 0; i < 16; i++) {
                if (mask & (1 << i)) {
                    gen_store(s, opsize, addr, mreg(tcg_ctx, i), IS_USER(s));
                    tcg_gen_add_i32(tcg_ctx, addr, addr, incr);
                }
            }
        }
    }

    tcg_temp_free(tcg_ctx, incr);
    tcg_temp_free(tcg_ctx, addr);
}